

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::WeightParams::MergePartialFromCodedStream
          (WeightParams *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int byte_limit;
  uint32 uVar7;
  unsigned_long uVar8;
  QuantizationParams *this_03;
  pair<int,_int> pVar9;
  char cVar10;
  ulong uVar11;
  string *value;
  pair<unsigned_long,_bool> pVar12;
  
  this_00 = &this->int8rawvalue_;
  this_01 = &this->rawvalue_;
  this_02 = &this->float16value_;
LAB_002229f6:
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_00222c80;
        uVar11 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_00222c80:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar7 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_00222a53;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (0x1e < uVar6) {
      if (uVar6 == 0x1f) {
        if (cVar10 == -6) {
          value = this_00->ptr_;
          if (value == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
          {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_00,(string *)
                               &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            value = this_00->ptr_;
          }
          goto LAB_00222b93;
        }
LAB_00222a53:
        if (uVar7 == 0) {
          return true;
        }
        if ((uVar7 & 7) == 4) {
          return true;
        }
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
        goto LAB_00222a73;
      }
      if (uVar6 == 0x28) {
        if (cVar10 != 'B') goto LAB_00222a53;
        this_03 = this->quantization_;
        if (this_03 == (QuantizationParams *)0x0) {
          this_03 = (QuantizationParams *)operator_new(0x28);
          QuantizationParams::QuantizationParams(this_03);
          this->quantization_ = this_03;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (byte_limit < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,byte_limit);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = QuantizationParams::MergePartialFromCodedStream(this_03,input);
        if (!bVar5) {
          return false;
        }
        bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar9.first);
        if (!bVar5) {
          return false;
        }
      }
      else {
        if ((uVar6 != 0x32) || (cVar10 != -0x70)) goto LAB_00222a53;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar4, -1 < (long)uVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar12.first;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->isupdatable_ = uVar8 != 0;
      }
      goto LAB_002229f6;
    }
    if (uVar6 != 1) {
      if (uVar6 == 2) {
        if (cVar10 == '\x12') {
          value = this_02->ptr_;
          if (value == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
          {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_02,(string *)
                               &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            value = this_02->ptr_;
          }
          goto LAB_00222b93;
        }
      }
      else if ((uVar6 == 0x1e) && (cVar10 == -0xe)) {
        value = this_01->ptr_;
        if (value == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          value = this_01->ptr_;
        }
LAB_00222b93:
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
        goto LAB_00222a73;
      }
      goto LAB_00222a53;
    }
    if (cVar10 == '\r') {
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (1,10,input,&this->floatvalue_);
    }
    else {
      if ((uVar7 & 0xff) != 10) goto LAB_00222a53;
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,&this->floatvalue_);
    }
LAB_00222a73:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool WeightParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.WeightParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated float floatValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_floatvalue())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(13u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 10u, input, this->mutable_floatvalue())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes float16Value = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_float16value()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes rawValue = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_rawvalue()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes int8RawValue = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_int8rawvalue()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.QuantizationParams quantization = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_quantization()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isUpdatable = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isupdatable_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.WeightParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.WeightParams)
  return false;
#undef DO_
}